

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

FT_Int ps_tofixedarray(FT_Byte **acur,FT_Byte *limit,FT_Int max_values,FT_Fixed *values,
                      FT_Int power_ten)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  FT_Fixed FVar5;
  FT_Int FVar6;
  long lVar7;
  byte *pbVar8;
  byte *local_40;
  FT_Long local_38;
  
  local_40 = *acur;
  FVar6 = 0;
  if (limit <= local_40) goto LAB_002304e1;
  if (*local_40 == 0x5b) {
    bVar1 = 0x5d;
LAB_002303e6:
    local_40 = local_40 + 1;
    bVar2 = false;
  }
  else {
    if (*local_40 == 0x7b) {
      bVar1 = 0x7d;
      goto LAB_002303e6;
    }
    bVar1 = 0;
    bVar2 = true;
  }
  local_38 = (FT_Long)power_ten;
  lVar7 = 0;
  do {
    if (limit <= local_40) break;
    do {
      uVar4 = (ulong)*local_40;
      pbVar8 = local_40;
      if (0x25 < uVar4) break;
      if ((0x100003601U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 != 0x25) break;
        bVar3 = 0x25;
        while (((pbVar8 = local_40 + 1, bVar3 != 10 && (bVar3 != 0xd)) &&
               (local_40 = limit, pbVar8 != limit))) {
          bVar3 = *pbVar8;
          local_40 = pbVar8;
        }
      }
      local_40 = local_40 + 1;
      pbVar8 = local_40;
    } while (local_40 < limit);
    local_40 = pbVar8;
    if (limit <= pbVar8) break;
    if (bVar1 == *pbVar8) {
      local_40 = pbVar8 + 1;
      break;
    }
    if (max_values <= lVar7 && values != (FT_Fixed *)0x0) break;
    FVar5 = PS_Conv_ToFixed(&local_40,limit,local_38);
    if (values != (FT_Fixed *)0x0) {
      values[lVar7] = FVar5;
    }
    if (pbVar8 == local_40) {
      lVar7 = 0xffffffff;
      break;
    }
    lVar7 = lVar7 + 1;
  } while (!bVar2);
  FVar6 = (FT_Int)lVar7;
LAB_002304e1:
  *acur = local_40;
  return FVar6;
}

Assistant:

static FT_Int
  ps_tofixedarray( FT_Byte*  *acur,
                   FT_Byte*   limit,
                   FT_Int     max_values,
                   FT_Fixed*  values,
                   FT_Int     power_ten )
  {
    FT_Byte*  cur   = *acur;
    FT_Int    count = 0;
    FT_Byte   c, ender;


    if ( cur >= limit )
      goto Exit;

    /* Check for the beginning of an array.  Otherwise, only one number */
    /* will be read.                                                    */
    c     = *cur;
    ender = 0;

    if ( c == '[' )
      ender = ']';
    else if ( c == '{' )
      ender = '}';

    if ( ender )
      cur++;

    /* now, read the values */
    while ( cur < limit )
    {
      FT_Fixed  dummy;
      FT_Byte*  old_cur;


      /* skip whitespace in front of data */
      skip_spaces( &cur, limit );
      if ( cur >= limit )
        goto Exit;

      if ( *cur == ender )
      {
        cur++;
        break;
      }

      old_cur = cur;

      if ( values && count >= max_values )
        break;

      /* call PS_Conv_ToFixed() even if coords == NULL */
      /* to properly parse number at `cur'             */
      *( values ? &values[count] : &dummy ) =
        PS_Conv_ToFixed( &cur, limit, power_ten );

      if ( old_cur == cur )
      {
        count = -1;
        goto Exit;
      }
      else
        count++;

      if ( !ender )
        break;
    }

  Exit:
    *acur = cur;
    return count;
  }